

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  int *piVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  byte bVar6;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var7;
  LogMessage *pLVar8;
  _Base_ptr p_Var9;
  Type *value;
  _Base_ptr p_Var10;
  string *psVar11;
  _Base_ptr p_Var12;
  size_t __n;
  long lVar13;
  void *__src;
  void *__dest;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar14;
  pair<int,_google::protobuf::internal::ExtensionSet::Extension> local_218;
  _Rb_tree_node_base *local_1f8;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  p_Var10 = (other->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1f8 = &(other->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var10 != local_1f8) {
    do {
      if (*(char *)((long)&p_Var10[1]._M_left + 1) == '\x01') {
        local_218.first = p_Var10[1]._M_color;
        p_Var9 = p_Var10[1]._M_right;
        local_218.second.field_0.int64_value = 0;
        local_218.second.type = '\0';
        local_218.second.is_repeated = false;
        local_218.second._10_1_ = 0;
        local_218.second.is_packed = false;
        local_218.second.cached_size = 0;
        local_218.second.descriptor = (FieldDescriptor *)0x0;
        pVar14 = std::
                 _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                 ::
                 _M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                           ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                             *)this,&local_218);
        _Var7 = pVar14.first._M_node;
        _Var7._M_node[1]._M_right = p_Var9;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (*(char *)&_Var7._M_node[1]._M_left != *(char *)&p_Var10[1]._M_left) {
            LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,0x2ba);
            pLVar8 = LogMessage::operator<<
                               (&local_d8,
                                "CHECK failed: (extension->type) == (other_extension.type): ");
            LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
            LogMessage::~LogMessage(&local_d8);
          }
          if (*(char *)((long)&_Var7._M_node[1]._M_left + 3) !=
              *(char *)((long)&p_Var10[1]._M_left + 3)) {
            LogMessage::LogMessage
                      (&local_110,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,699);
            pLVar8 = LogMessage::operator<<
                               (&local_110,
                                "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                               );
            LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
            LogMessage::~LogMessage(&local_110);
          }
          if (*(char *)((long)&_Var7._M_node[1]._M_left + 1) == '\0') {
            LogMessage::LogMessage
                      (&local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,700);
            pLVar8 = LogMessage::operator<<(&local_148,"CHECK failed: extension->is_repeated: ");
            LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
            LogMessage::~LogMessage(&local_148);
          }
        }
        else {
          *(undefined1 *)&_Var7._M_node[1]._M_left = *(undefined1 *)&p_Var10[1]._M_left;
          *(undefined1 *)((long)&_Var7._M_node[1]._M_left + 3) =
               *(undefined1 *)((long)&p_Var10[1]._M_left + 3);
          *(undefined1 *)((long)&_Var7._M_node[1]._M_left + 1) = 1;
        }
        bVar6 = *(byte *)&p_Var10[1]._M_left;
        if ((byte)(bVar6 - 0x13) < 0xee) {
          LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,0x35);
          pLVar8 = LogMessage::operator<<
                             (&local_a0,
                              "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
          LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
          LogMessage::~LogMessage(&local_a0);
        }
        switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar6 * 4)) {
        case 1:
        case 8:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (*(int *)&p_Var9->_M_parent != 0) {
            p_Var12 = _Var7._M_node[1]._M_parent;
            RepeatedField<int>::Reserve
                      ((RepeatedField<int> *)p_Var12,
                       *(int *)&p_Var9->_M_parent + *(int *)&p_Var12->_M_parent);
LAB_00167fcd:
            __dest = (void *)((long)*(int *)&p_Var12->_M_parent * 4 + *(long *)p_Var12);
            __src = *(void **)p_Var9;
            __n = (long)*(int *)&p_Var9->_M_parent << 2;
LAB_00167fe5:
            memcpy(__dest,__src,__n);
            *(int *)&p_Var12->_M_parent = *(int *)&p_Var12->_M_parent + *(int *)&p_Var9->_M_parent;
          }
          break;
        case 2:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (*(int *)&p_Var9->_M_parent != 0) {
            p_Var12 = _Var7._M_node[1]._M_parent;
            RepeatedField<long>::Reserve
                      ((RepeatedField<long> *)p_Var12,
                       *(int *)&p_Var9->_M_parent + *(int *)&p_Var12->_M_parent);
LAB_00167f7d:
            __dest = (void *)((long)*(int *)&p_Var12->_M_parent * 8 + *(long *)p_Var12);
            __src = *(void **)p_Var9;
            __n = (long)*(int *)&p_Var9->_M_parent << 3;
            goto LAB_00167fe5;
          }
          break;
        case 3:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (*(int *)&p_Var9->_M_parent != 0) {
            p_Var12 = _Var7._M_node[1]._M_parent;
            RepeatedField<unsigned_int>::Reserve
                      ((RepeatedField<unsigned_int> *)p_Var12,
                       *(int *)&p_Var9->_M_parent + *(int *)&p_Var12->_M_parent);
            goto LAB_00167fcd;
          }
          break;
        case 4:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (*(int *)&p_Var9->_M_parent != 0) {
            p_Var12 = _Var7._M_node[1]._M_parent;
            RepeatedField<unsigned_long>::Reserve
                      ((RepeatedField<unsigned_long> *)p_Var12,
                       *(int *)&p_Var9->_M_parent + *(int *)&p_Var12->_M_parent);
            goto LAB_00167f7d;
          }
          break;
        case 5:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (*(int *)&p_Var9->_M_parent != 0) {
            p_Var12 = _Var7._M_node[1]._M_parent;
            RepeatedField<double>::Reserve
                      ((RepeatedField<double> *)p_Var12,
                       *(int *)&p_Var9->_M_parent + *(int *)&p_Var12->_M_parent);
            goto LAB_00167f7d;
          }
          break;
        case 6:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (*(int *)&p_Var9->_M_parent != 0) {
            p_Var12 = _Var7._M_node[1]._M_parent;
            RepeatedField<float>::Reserve
                      ((RepeatedField<float> *)p_Var12,
                       *(int *)&p_Var9->_M_parent + *(int *)&p_Var12->_M_parent);
            goto LAB_00167fcd;
          }
          break;
        case 7:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (*(int *)&p_Var9->_M_parent != 0) {
            p_Var12 = _Var7._M_node[1]._M_parent;
            RepeatedField<bool>::Reserve
                      ((RepeatedField<bool> *)p_Var12,
                       *(int *)&p_Var9->_M_parent + *(int *)&p_Var12->_M_parent);
            __dest = (void *)((long)*(int *)&p_Var12->_M_parent + *(long *)p_Var12);
            __src = *(void **)p_Var9;
            __n = (size_t)*(int *)&p_Var9->_M_parent;
            goto LAB_00167fe5;
          }
          break;
        case 9:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x18);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            *(undefined4 *)&p_Var9->_M_left = 0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = _Var7._M_node[1]._M_parent;
          p_Var12 = p_Var10[1]._M_parent;
          RepeatedPtrFieldBase::Reserve
                    ((RepeatedPtrFieldBase *)p_Var9,
                     *(int *)&p_Var12->_M_parent + *(int *)&p_Var9->_M_parent);
          if (0 < *(int *)&p_Var12->_M_parent) {
            lVar13 = 0;
            do {
              iVar3 = *(int *)&p_Var9->_M_parent;
              iVar4 = *(int *)((long)&p_Var9->_M_parent + 4);
              if (iVar3 < iVar4) {
                *(int *)&p_Var9->_M_parent = iVar3 + 1;
                psVar11 = *(string **)(*(long *)p_Var9 + (long)iVar3 * 8);
              }
              else {
                if (iVar4 == *(int *)&p_Var9->_M_left) {
                  RepeatedPtrFieldBase::Reserve
                            ((RepeatedPtrFieldBase *)p_Var9,*(int *)&p_Var9->_M_left + 1);
                }
                piVar1 = (int *)((long)&p_Var9->_M_parent + 4);
                *piVar1 = *piVar1 + 1;
                psVar11 = StringTypeHandlerBase::New_abi_cxx11_();
                iVar3 = *(int *)&p_Var9->_M_parent;
                *(int *)&p_Var9->_M_parent = iVar3 + 1;
                *(string **)(*(long *)p_Var9 + (long)iVar3 * 8) = psVar11;
              }
              std::__cxx11::string::_M_assign((string *)psVar11);
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)&p_Var12->_M_parent);
          }
          break;
        case 10:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var9 = (_Base_ptr)operator_new(0x18);
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            *(undefined4 *)&p_Var9->_M_left = 0;
            _Var7._M_node[1]._M_parent = p_Var9;
          }
          p_Var9 = p_Var10[1]._M_parent;
          if (0 < *(int *)&p_Var9->_M_parent) {
            lVar13 = 0;
            do {
              plVar5 = *(long **)(*(long *)p_Var9 + lVar13 * 8);
              p_Var12 = _Var7._M_node[1]._M_parent;
              iVar3 = *(int *)&p_Var12->_M_parent;
              if (iVar3 < *(int *)((long)&p_Var12->_M_parent + 4)) {
                *(int *)&p_Var12->_M_parent = iVar3 + 1;
                value = *(Type **)(*(long *)p_Var12 + (long)iVar3 * 8);
              }
              else {
                value = (Type *)0x0;
              }
              if (value == (Type *)0x0) {
                value = (Type *)(**(code **)(*plVar5 + 0x18))(plVar5);
                RepeatedPtrFieldBase::
                AddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                          ((RepeatedPtrFieldBase *)_Var7._M_node[1]._M_parent,value);
              }
              (*value->_vptr_MessageLite[7])(value,plVar5);
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)&p_Var9->_M_parent);
          }
        }
      }
      else if (((ulong)p_Var10[1]._M_left & 0x10000) == 0) {
        bVar6 = *(byte *)&p_Var10[1]._M_left;
        if ((byte)(bVar6 - 0x13) < 0xee) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,0x35);
          pLVar8 = LogMessage::operator<<
                             (&local_68,
                              "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
          LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
          LogMessage::~LogMessage(&local_68);
        }
        switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar6 * 4)) {
        case 1:
          SetInt32(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                   *(int32 *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 2:
          SetInt64(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                   (int64)p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 3:
          SetUInt32(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                    *(uint32 *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 4:
          SetUInt64(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                    (uint64)p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 5:
          SetDouble(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                    (double)p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 6:
          SetFloat(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                   *(float *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 7:
          SetBool(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                  *(bool *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 8:
          SetEnum(this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                  *(int *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
          break;
        case 9:
          psVar11 = MutableString_abi_cxx11_
                              (this,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                               (FieldDescriptor *)p_Var10[1]._M_right);
          std::__cxx11::string::_M_assign((string *)psVar11);
          break;
        case 10:
          local_218.first = p_Var10[1]._M_color;
          p_Var9 = p_Var10[1]._M_right;
          local_218.second.field_0.int64_value = 0;
          local_218.second.type = '\0';
          local_218.second.is_repeated = false;
          local_218.second._10_1_ = 0;
          local_218.second.is_packed = false;
          local_218.second.cached_size = 0;
          local_218.second.descriptor = (FieldDescriptor *)0x0;
          pVar14 = std::
                   _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                   ::
                   _M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                             ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                               *)this,&local_218);
          _Var7 = pVar14.first._M_node;
          _Var7._M_node[1]._M_right = p_Var9;
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if (*(char *)&_Var7._M_node[1]._M_left != *(char *)&p_Var10[1]._M_left) {
              LogMessage::LogMessage
                        (&local_180,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                         ,0x319);
              pLVar8 = LogMessage::operator<<
                                 (&local_180,
                                  "CHECK failed: (extension->type) == (other_extension.type): ");
              LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
              LogMessage::~LogMessage(&local_180);
            }
            if (*(char *)((long)&_Var7._M_node[1]._M_left + 3) !=
                *(char *)((long)&p_Var10[1]._M_left + 3)) {
              LogMessage::LogMessage
                        (&local_1b8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                         ,0x31a);
              pLVar8 = LogMessage::operator<<
                                 (&local_1b8,
                                  "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                                 );
              LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
              LogMessage::~LogMessage(&local_1b8);
            }
            if (*(char *)((long)&_Var7._M_node[1]._M_left + 1) == '\x01') {
              LogMessage::LogMessage
                        (&local_1f0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                         ,0x31b);
              pLVar8 = LogMessage::operator<<(&local_1f0,"CHECK failed: !extension->is_repeated: ");
              LogFinisher::operator=((LogFinisher *)&local_218,pLVar8);
              LogMessage::~LogMessage(&local_1f0);
            }
            p_Var9 = _Var7._M_node[1]._M_parent;
            if (((ulong)p_Var10[1]._M_left & 0x100000) == 0) {
              if (((ulong)_Var7._M_node[1]._M_left & 0x100000) != 0) {
                p_Var9 = (_Base_ptr)(**(code **)(*(long *)p_Var9 + 0x20))(p_Var9);
                goto LAB_001683a7;
              }
              (**(code **)(*(long *)p_Var9 + 0x38))();
            }
            else {
              if (((ulong)_Var7._M_node[1]._M_left & 0x100000) == 0) {
                p_Var12 = (_Base_ptr)
                          (**(code **)(*(long *)p_Var10[1]._M_parent + 0x18))
                                    (p_Var10[1]._M_parent,p_Var9);
                lVar13 = *(long *)p_Var9;
                goto LAB_001683b1;
              }
              (**(code **)(*(long *)p_Var9 + 0x50))(p_Var9);
            }
          }
          else {
            *(undefined1 *)&_Var7._M_node[1]._M_left = *(undefined1 *)&p_Var10[1]._M_left;
            *(undefined1 *)((long)&_Var7._M_node[1]._M_left + 3) =
                 *(undefined1 *)((long)&p_Var10[1]._M_left + 3);
            *(undefined1 *)((long)&_Var7._M_node[1]._M_left + 1) = 0;
            bVar6 = *(byte *)((long)&_Var7._M_node[1]._M_left + 2) & 0xf;
            if (((ulong)p_Var10[1]._M_left & 0x100000) == 0) {
              *(byte *)((long)&_Var7._M_node[1]._M_left + 2) = bVar6;
              p_Var9 = (_Base_ptr)(**(code **)(*(long *)p_Var10[1]._M_parent + 0x18))();
              _Var7._M_node[1]._M_parent = p_Var9;
LAB_001683a7:
              p_Var12 = p_Var10[1]._M_parent;
              lVar13 = *(long *)p_Var9;
LAB_001683b1:
              (**(code **)(lVar13 + 0x38))(p_Var9,p_Var12);
            }
            else {
              *(byte *)((long)&_Var7._M_node[1]._M_left + 2) = bVar6 | 0x10;
              p_Var9 = (_Base_ptr)(**(code **)(*(long *)p_Var10[1]._M_parent + 0x10))();
              _Var7._M_node[1]._M_parent = p_Var9;
              (**(code **)(*(long *)p_Var9 + 0x50))(p_Var9,p_Var10[1]._M_parent);
            }
          }
          pbVar2 = (byte *)((long)&_Var7._M_node[1]._M_left + 2);
          *pbVar2 = *pbVar2 & 0xf0;
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_1f8);
  }
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  for (map<int, Extension>::const_iterator iter = other.extensions_.begin();
       iter != other.extensions_.end(); ++iter) {
    const Extension& other_extension = iter->second;

    if (other_extension.is_repeated) {
      Extension* extension;
      bool is_new = MaybeNewExtension(iter->first, other_extension.descriptor,
                                      &extension);
      if (is_new) {
        // Extension did not already exist in set.
        extension->type = other_extension.type;
        extension->is_packed = other_extension.is_packed;
        extension->is_repeated = true;
      } else {
        GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
        GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
        GOOGLE_DCHECK(extension->is_repeated);
      }

      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)             \
        case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
          if (is_new) {                                              \
            extension->repeated_##LOWERCASE##_value =                \
              new REPEATED_TYPE;                                     \
          }                                                          \
          extension->repeated_##LOWERCASE##_value->MergeFrom(        \
            *other_extension.repeated_##LOWERCASE##_value);          \
          break;

        HANDLE_TYPE(  INT32,   int32, RepeatedField   <  int32>);
        HANDLE_TYPE(  INT64,   int64, RepeatedField   <  int64>);
        HANDLE_TYPE( UINT32,  uint32, RepeatedField   < uint32>);
        HANDLE_TYPE( UINT64,  uint64, RepeatedField   < uint64>);
        HANDLE_TYPE(  FLOAT,   float, RepeatedField   <  float>);
        HANDLE_TYPE( DOUBLE,  double, RepeatedField   < double>);
        HANDLE_TYPE(   BOOL,    bool, RepeatedField   <   bool>);
        HANDLE_TYPE(   ENUM,    enum, RepeatedField   <    int>);
        HANDLE_TYPE( STRING,  string, RepeatedPtrField< string>);
#undef HANDLE_TYPE

        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_new) {
            extension->repeated_message_value =
              new RepeatedPtrField<MessageLite>();
          }
          // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
          // it would attempt to allocate new objects.
          RepeatedPtrField<MessageLite>* other_repeated_message =
              other_extension.repeated_message_value;
          for (int i = 0; i < other_repeated_message->size(); i++) {
            const MessageLite& other_message = other_repeated_message->Get(i);
            MessageLite* target = extension->repeated_message_value
                     ->AddFromCleared<GenericTypeHandler<MessageLite> >();
            if (target == NULL) {
              target = other_message.New();
              extension->repeated_message_value->AddAllocated(target);
            }
            target->CheckTypeAndMergeFrom(other_message);
          }
          break;
      }
    } else {
      if (!other_extension.is_cleared) {
        switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)                         \
          case WireFormatLite::CPPTYPE_##UPPERCASE:                          \
            Set##CAMELCASE(iter->first, other_extension.type,                \
                           other_extension.LOWERCASE##_value,                \
                           other_extension.descriptor);                      \
            break;

          HANDLE_TYPE( INT32,  int32,  Int32);
          HANDLE_TYPE( INT64,  int64,  Int64);
          HANDLE_TYPE(UINT32, uint32, UInt32);
          HANDLE_TYPE(UINT64, uint64, UInt64);
          HANDLE_TYPE( FLOAT,  float,  Float);
          HANDLE_TYPE(DOUBLE, double, Double);
          HANDLE_TYPE(  BOOL,   bool,   Bool);
          HANDLE_TYPE(  ENUM,   enum,   Enum);
#undef HANDLE_TYPE
          case WireFormatLite::CPPTYPE_STRING:
            SetString(iter->first, other_extension.type,
                      *other_extension.string_value,
                      other_extension.descriptor);
            break;
          case WireFormatLite::CPPTYPE_MESSAGE: {
            Extension* extension;
            bool is_new = MaybeNewExtension(iter->first,
                                            other_extension.descriptor,
                                            &extension);
            if (is_new) {
              extension->type = other_extension.type;
              extension->is_packed = other_extension.is_packed;
              extension->is_repeated = false;
              if (other_extension.is_lazy) {
                extension->is_lazy = true;
                extension->lazymessage_value =
                    other_extension.lazymessage_value->New();
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->is_lazy = false;
                extension->message_value =
                    other_extension.message_value->New();
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            } else {
              GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
              GOOGLE_DCHECK_EQ(extension->is_packed,other_extension.is_packed);
              GOOGLE_DCHECK(!extension->is_repeated);
              if (other_extension.is_lazy) {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MergeFrom(
                      *other_extension.lazymessage_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      other_extension.lazymessage_value->GetMessage(
                          *extension->message_value));
                }
              } else {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MutableMessage(
                      *other_extension.message_value)->CheckTypeAndMergeFrom(
                          *other_extension.message_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      *other_extension.message_value);
                }
              }
            }
            extension->is_cleared = false;
            break;
          }
        }
      }
    }
  }
}